

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall libcellml::Variable::Variable(Variable *this,string *name)

{
  VariableImpl *this_00;
  
  this_00 = (VariableImpl *)operator_new(0x120);
  memset(this_00,0,0x120);
  VariableImpl::VariableImpl(this_00);
  NamedEntity::NamedEntity(&this->super_NamedEntity,(NamedEntityImpl *)this_00);
  (this->super_enable_shared_from_this<libcellml::Variable>)._M_weak_this.
  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<libcellml::Variable>)._M_weak_this.
  super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)&PTR__Variable_002a0818;
  (this->super_NamedEntity).super_ParentedEntity.super_Entity.mPimpl[2].mId.field_2.
  _M_allocated_capacity = (size_type)this;
  NamedEntity::setName(&this->super_NamedEntity,name);
  return;
}

Assistant:

Variable::Variable(const std::string &name)
    : NamedEntity(new Variable::VariableImpl())
{
    pFunc()->mVariable = this;
    setName(name);
}